

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::KeyValue::read(KeyValue *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  TProtocolException *this_00;
  undefined4 in_register_00000034;
  bool isset_key;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff58;
  TProtocolExceptionType in_stack_ffffffffffffff5c;
  TProtocol *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint32_t in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff74;
  short local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  KeyValue *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)in_stack_ffffffffffffff60,
             (TProtocol *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    (in_stack_ffffffffffffff60,
                     (string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  local_1c = uVar2 + local_1c;
  bVar1 = false;
  while( true ) {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (TType *)in_stack_ffffffffffffff60,
                       (int16_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_1c = uVar2 + local_1c;
    if (local_44 == 0) break;
    if (local_46 == 1) {
      if (local_44 == 0xb) {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readString
                          (in_stack_ffffffffffffff60,
                           (string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        local_1c = uVar2 + local_1c;
        bVar1 = true;
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        local_1c = uVar2 + local_1c;
      }
    }
    else if (local_46 == 2) {
      if (local_44 == 0xb) {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readString
                          (in_stack_ffffffffffffff60,
                           (string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        local_1c = uVar2 + local_1c;
        this->__isset = (_KeyValue__isset)((byte)this->__isset & 0xfe | 1);
      }
      else {
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::skip
                          (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
        local_1c = uVar2 + local_1c;
      }
    }
    else {
      in_stack_ffffffffffffff74 =
           duckdb_apache::thrift::protocol::TProtocol::skip
                     (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      local_1c = in_stack_ffffffffffffff74 + local_1c;
    }
    in_stack_ffffffffffffff70 =
         duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x70ab48);
    local_1c = in_stack_ffffffffffffff70 + local_1c;
  }
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x70ab72);
  uVar3 = uVar2 + local_1c;
  local_1c = uVar3;
  if (bVar1) {
    std::__cxx11::string::~string(local_40);
    duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
              ((TInputRecursionTracker *)0x70ac08);
    return (ulong)uVar3;
  }
  this_00 = (TProtocolException *)__cxa_allocate_exception(0x30);
  duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
            (this_00,in_stack_ffffffffffffff5c);
  __cxa_throw(this_00,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
              duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t KeyValue::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_key = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->key);
          isset_key = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->value);
          this->__isset.value = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_key)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}